

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall
ON_RevSurface::GetNextDiscontinuity
          (ON_RevSurface *this,int dir,continuity c,double t0,double t1,double *t,int *hint,
          int *dtype,double cos_angle_tolerance,double curvature_tolerance)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  double t0_00;
  double t1_00;
  ON_Arc arc;
  ON_Circle circle;
  ON_ArcCurve arc_curve;
  
  if ((uint)this->m_bTransposed == dir) {
    ON_Circle::ON_Circle(&circle,&ON_xy_plane,1.0);
    ON_Arc::ON_Arc(&arc,&circle,(ON_Interval)*&(this->m_angle).m_t);
    t0_00 = ON_Interval::operator[](&this->m_t,0);
    t1_00 = ON_Interval::operator[](&this->m_t,1);
    ON_ArcCurve::ON_ArcCurve(&arc_curve,&arc,t0_00,t1_00);
    piVar3 = hint + (uint)dir;
    if (hint == (int *)0x0) {
      piVar3 = (int *)0x0;
    }
    bVar1 = ON_Curve::GetNextDiscontinuity
                      (&arc_curve.super_ON_Curve,c,t0,t1,t,piVar3,dtype,cos_angle_tolerance,
                       curvature_tolerance);
    ON_ArcCurve::~ON_ArcCurve(&arc_curve);
    ON_Plane::~ON_Plane((ON_Plane *)&arc);
    ON_Plane::~ON_Plane(&circle.plane);
    return bVar1;
  }
  piVar3 = hint + dir;
  if (hint == (int *)0x0) {
    piVar3 = (int *)0x0;
  }
  iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                    (this->m_curve,(ulong)c,t,piVar3,dtype);
  return SUB41(iVar2,0);
}

Assistant:

bool ON_RevSurface::GetNextDiscontinuity( 
                int dir,
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  // 28 Jan 2005 - untested code
  bool rc = false;
  if ( (m_bTransposed ? 1 : 0) == dir )
  {
    // angle direction
    ON_Circle circle(ON_xy_plane,1.0);
    ON_Arc arc( circle, m_angle );
    ON_ArcCurve arc_curve(arc, m_t[0], m_t[1]);
    rc = arc_curve.GetNextDiscontinuity(
      c,
      t0,t1,t,
      (hint? &hint[dir] : 0),
      dtype,cos_angle_tolerance,
      curvature_tolerance);
  }
  else
  {
    rc = m_curve->GetNextDiscontinuity(
      c,
      t0,t1,t,
      (hint? &hint[dir] : 0),
      dtype,cos_angle_tolerance,
      curvature_tolerance);
  }
  return rc;
}